

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetEffectSourcePrivate::draw(QWidgetEffectSourcePrivate *this,QPainter *painter)

{
  long lVar1;
  QWidgetPaintContext *pQVar2;
  QWidget *this_00;
  QWidgetPrivate *this_01;
  QWExtra *pQVar3;
  undefined1 auVar4 [16];
  long in_FS_OFFSET;
  QRect local_40;
  QRegion toBePainted;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->context;
  if ((pQVar2 == (QWidgetPaintContext *)0x0) || (pQVar2->painter != painter)) {
    this_00 = this->m_widget;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40._0_8_;
    local_40 = (QRect)(auVar4 << 0x40);
    QRegion::QRegion(&toBePainted);
    QWidget::render(this_00,painter,(QPoint *)&local_40,&toBePainted,(RenderFlags)0x3);
  }
  else {
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&toBePainted,&pQVar2->rgn);
    local_40 = QWidget::rect(this->m_widget);
    QRegion::operator&=(&toBePainted,&local_40);
    this_01 = *(QWidgetPrivate **)&this->m_widget->field_0x8;
    pQVar3 = (this_01->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7c & 0x80) != 0)) {
      QRegion::operator&=(&toBePainted,&pQVar3->mask);
    }
    pQVar2 = this->context;
    QWidgetPrivate::drawWidget
              (this_01,pQVar2->pdev,&toBePainted,&pQVar2->offset,
               (DrawWidgetFlags)
               (pQVar2->flags).super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i,pQVar2->sharedPainter,
               pQVar2->repaintManager);
  }
  QRegion::~QRegion(&toBePainted);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetEffectSourcePrivate::draw(QPainter *painter)
{
    if (!context || context->painter != painter) {
        m_widget->render(painter);
        return;
    }

    // The region saved in the context is neither clipped to the rect
    // nor the mask, so we have to clip it here before calling drawWidget.
    QRegion toBePainted = context->rgn;
    toBePainted &= m_widget->rect();
    QWidgetPrivate *wd = qt_widget_private(m_widget);
    if (wd->extra && wd->extra->hasMask)
        toBePainted &= wd->extra->mask;

    wd->drawWidget(context->pdev, toBePainted, context->offset, context->flags,
                   context->sharedPainter, context->repaintManager);
}